

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int8_suite::run(void)

{
  test_array8_int8_empty();
  test_array8_int8_one();
  test_array8_int8_two();
  test_array8_int8_128();
  fail_array8_int8_missing_one();
  fail_array8_int8_missing_length();
  fail_array8_int8_overflow();
  test_array16_int8_empty();
  test_array16_int8_one();
  test_array16_int8_two();
  fail_array16_int8_missing_one();
  fail_array16_int8_missing_length_one();
  fail_array16_int8_missing_length_two();
  test_array32_int8_empty();
  test_array32_int8_one();
  test_array32_int8_two();
  fail_array32_int8_missing_one();
  fail_array32_int8_missing_length_one();
  fail_array32_int8_missing_length_two();
  fail_array32_int8_missing_length_three();
  fail_array32_int8_missing_length_four();
  test_array64_int8_empty();
  test_array64_int8_one();
  test_array64_int8_two();
  fail_array64_int8_missing_one();
  fail_array64_int8_missing_length_one();
  fail_array64_int8_missing_length_two();
  fail_array64_int8_missing_length_three();
  fail_array64_int8_missing_length_four();
  fail_array64_int8_missing_length_five();
  fail_array64_int8_missing_length_six();
  fail_array64_int8_missing_length_seven();
  fail_array64_int8_missing_length_eight();
  return;
}

Assistant:

void run()
{
    test_array8_int8_empty();
    test_array8_int8_one();
    test_array8_int8_two();
    test_array8_int8_128();
    fail_array8_int8_missing_one();
    fail_array8_int8_missing_length();
    fail_array8_int8_overflow();

    test_array16_int8_empty();
    test_array16_int8_one();
    test_array16_int8_two();
    fail_array16_int8_missing_one();
    fail_array16_int8_missing_length_one();
    fail_array16_int8_missing_length_two();

    test_array32_int8_empty();
    test_array32_int8_one();
    test_array32_int8_two();
    fail_array32_int8_missing_one();
    fail_array32_int8_missing_length_one();
    fail_array32_int8_missing_length_two();
    fail_array32_int8_missing_length_three();
    fail_array32_int8_missing_length_four();

    test_array64_int8_empty();
    test_array64_int8_one();
    test_array64_int8_two();
    fail_array64_int8_missing_one();
    fail_array64_int8_missing_length_one();
    fail_array64_int8_missing_length_two();
    fail_array64_int8_missing_length_three();
    fail_array64_int8_missing_length_four();
    fail_array64_int8_missing_length_five();
    fail_array64_int8_missing_length_six();
    fail_array64_int8_missing_length_seven();
    fail_array64_int8_missing_length_eight();
}